

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::classify_elements(Mesh *mesh)

{
  Int ent_dim;
  LO size_in;
  Int IVar1;
  allocator local_72;
  allocator local_71;
  Write<signed_char> local_70;
  string local_60;
  string local_40;
  
  ent_dim = Mesh::dim(mesh);
  std::__cxx11::string::string((string *)&local_40,"class_dim",&local_71);
  size_in = Mesh::nelems(mesh);
  IVar1 = Mesh::dim(mesh);
  std::__cxx11::string::string((string *)&local_60,"",&local_72);
  Read<signed_char>::Read((Read<signed_char> *)&local_70,size_in,(char)IVar1,&local_60);
  Mesh::add_tag<signed_char>(mesh,ent_dim,&local_40,1,(Read<signed_char> *)&local_70,false);
  Write<signed_char>::~Write(&local_70);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void classify_elements(Mesh* mesh) {
  mesh->add_tag<I8>(mesh->dim(), "class_dim", 1,

      Read<I8>(mesh->nelems(), static_cast<I8>(mesh->dim())));
}